

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall leveldb::DBImpl::Write(DBImpl *this,WriteOptions *options,WriteBatch *updates)

{
  pthread_mutex_t *__mutex;
  long lVar1;
  Writer *pWVar2;
  _func_int **pp_Var3;
  Writer *pWVar4;
  int iVar5;
  _func_int **pp_Var6;
  MemTable *b;
  char *pcVar7;
  long in_RCX;
  ulong uVar8;
  bool bVar9;
  Writer *last_writer;
  Writer w;
  undefined1 local_c0 [8];
  size_type sStack_b8;
  undefined4 local_ac;
  undefined8 local_a8;
  Writer *local_a0;
  WriteBatch *local_98;
  undefined1 local_90 [8];
  Writer local_88;
  
  __mutex = (pthread_mutex_t *)(options + 200);
  local_88.status.state_ = (char *)0x0;
  local_88.batch = (WriteBatch *)0x0;
  local_88.sync = false;
  local_88.done = false;
  port::CondVar::CondVar(&local_88.cv,(Mutex *)&__mutex->__data);
  local_88.done = false;
  local_88.sync = (bool)*(byte *)&(updates->rep_)._M_dataplus._M_p;
  local_98 = updates;
  iVar5 = pthread_mutex_lock(__mutex);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  local_c0 = (undefined1  [8])&local_88;
  if (*(long **)(options + 0x198) == (long *)(*(long *)(options + 0x1a8) + -8)) {
    std::deque<leveldb::DBImpl::Writer*,std::allocator<leveldb::DBImpl::Writer*>>::
    _M_push_back_aux<leveldb::DBImpl::Writer*>
              ((deque<leveldb::DBImpl::Writer*,std::allocator<leveldb::DBImpl::Writer*>> *)
               (options + 0x168),(Writer **)local_c0);
  }
  else {
    **(long **)(options + 0x198) = (long)&local_88;
    *(long *)(options + 0x198) = *(long *)(options + 0x198) + 8;
  }
  if (local_88.done == false) {
    if (&local_88 != (Writer *)**(long **)(options + 0x178)) {
      do {
        local_c0 = (undefined1  [8])local_88.cv.mu_;
        sStack_b8._0_1_ = true;
        std::condition_variable::wait((unique_lock *)&local_88.cv);
        local_c0 = (undefined1  [8])0x0;
        sStack_b8 = (ulong)sStack_b8._1_7_ << 8;
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_c0);
        if (local_88.done != false) goto LAB_0010e053;
      } while (&local_88 != (Writer *)**(long **)(options + 0x178));
    }
    MakeRoomForWrite(this,SUB81(options,0));
    lVar1 = *(long *)(*(long *)(options + 0x228) + 0x58);
    local_a0 = &local_88;
    if (in_RCX != 0 && (this->super_DB)._vptr_DB == (_func_int **)0x0) {
      b = (MemTable *)BuildBatchGroup((DBImpl *)options,&local_a0);
      WriteBatchInternal::SetSequence((WriteBatch *)b,lVar1 + 1);
      local_ac = WriteBatchInternal::Count((WriteBatch *)b);
      pthread_mutex_unlock(__mutex);
      local_c0 = (undefined1  [8])(((string *)&b->comparator_)->_M_dataplus)._M_p;
      sStack_b8 = ((string *)&b->comparator_)->_M_string_length;
      local_a8 = b;
      log::Writer::AddRecord((Writer *)local_90,*(Slice **)(options + 0x158));
      (this->super_DB)._vptr_DB = (_func_int **)local_90;
      if ((local_90 == (undefined1  [8])0x0) &&
         (*(char *)&(local_98->rep_)._M_dataplus._M_p == '\x01')) {
        (**(code **)(**(long **)(options + 0x148) + 0x28))(local_c0);
        (this->super_DB)._vptr_DB = (_func_int **)local_c0;
        bVar9 = local_c0 != (undefined1  [8])0x0;
      }
      else {
        bVar9 = false;
      }
      if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
        WriteBatchInternal::InsertInto((WriteBatch *)local_c0,(MemTable *)local_a8);
        (this->super_DB)._vptr_DB = (_func_int **)local_c0;
      }
      iVar5 = pthread_mutex_lock(__mutex);
      if (iVar5 != 0) {
        std::__throw_system_error(iVar5);
      }
      if (bVar9) {
        RecordBackgroundError((DBImpl *)options,(Status *)this);
      }
      if ((MemTable *)local_a8 == *(MemTable **)(options + 0x1b8)) {
        WriteBatch::Clear((WriteBatch *)*(MemTable **)(options + 0x1b8));
      }
      uVar8 = lVar1 + (int)local_ac;
      if (uVar8 < *(ulong *)(*(long *)(options + 0x228) + 0x58)) {
        __assert_fail("s >= last_sequence_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.h"
                      ,0xd8,"void leveldb::VersionSet::SetLastSequence(uint64_t)");
      }
      *(ulong *)(*(long *)(options + 0x228) + 0x58) = uVar8;
    }
    pWVar4 = local_a0;
    pp_Var6 = (this->super_DB)._vptr_DB;
    do {
      pWVar2 = (Writer *)**(long **)(options + 0x178);
      std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::pop_front
                ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
                 (options + 0x168));
      if (pWVar2 != &local_88) {
        pp_Var3 = (_func_int **)(pWVar2->status).state_;
        if (pp_Var3 != pp_Var6) {
          if (pp_Var3 != (_func_int **)0x0) {
            operator_delete__(pp_Var3);
          }
          if (pp_Var6 == (_func_int **)0x0) {
            pcVar7 = (char *)0x0;
          }
          else {
            pcVar7 = Status::CopyState((char *)pp_Var6);
          }
          (pWVar2->status).state_ = pcVar7;
        }
        pWVar2->done = true;
        std::condition_variable::notify_one();
      }
    } while (pWVar2 != pWVar4);
    if (*(long *)(options + 0x198) != *(long *)(options + 0x178)) {
      std::condition_variable::notify_one();
    }
  }
  else {
LAB_0010e053:
    if (local_88.status.state_ == (char *)0x0) {
      pp_Var6 = (_func_int **)0x0;
    }
    else {
      pp_Var6 = (_func_int **)Status::CopyState(local_88.status.state_);
    }
    (this->super_DB)._vptr_DB = pp_Var6;
  }
  pthread_mutex_unlock(__mutex);
  std::condition_variable::~condition_variable(&local_88.cv.cv_);
  if (local_88.status.state_ != (char *)0x0) {
    operator_delete__(local_88.status.state_);
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::Write(const WriteOptions& options, WriteBatch* updates) {
  Writer w(&mutex_);
  w.batch = updates;
  w.sync = options.sync;
  w.done = false;

  MutexLock l(&mutex_);
  writers_.push_back(&w);
  while (!w.done && &w != writers_.front()) {
    w.cv.Wait();
  }
  if (w.done) {
    return w.status;
  }

  // May temporarily unlock and wait.
  Status status = MakeRoomForWrite(updates == nullptr);
  uint64_t last_sequence = versions_->LastSequence();
  Writer* last_writer = &w;
  if (status.ok() && updates != nullptr) {  // nullptr batch is for compactions
    WriteBatch* updates = BuildBatchGroup(&last_writer);
    WriteBatchInternal::SetSequence(updates, last_sequence + 1);
    last_sequence += WriteBatchInternal::Count(updates);

    // Add to log and apply to memtable.  We can release the lock
    // during this phase since &w is currently responsible for logging
    // and protects against concurrent loggers and concurrent writes
    // into mem_.
    {
      mutex_.Unlock();
      status = log_->AddRecord(WriteBatchInternal::Contents(updates));
      bool sync_error = false;
      if (status.ok() && options.sync) {
        status = logfile_->Sync();
        if (!status.ok()) {
          sync_error = true;
        }
      }
      if (status.ok()) {
        status = WriteBatchInternal::InsertInto(updates, mem_);
      }
      mutex_.Lock();
      if (sync_error) {
        // The state of the log file is indeterminate: the log record we
        // just added may or may not show up when the DB is re-opened.
        // So we force the DB into a mode where all future writes fail.
        RecordBackgroundError(status);
      }
    }
    if (updates == tmp_batch_) tmp_batch_->Clear();

    versions_->SetLastSequence(last_sequence);
  }

  while (true) {
    Writer* ready = writers_.front();
    writers_.pop_front();
    if (ready != &w) {
      ready->status = status;
      ready->done = true;
      ready->cv.Signal();
    }
    if (ready == last_writer) break;
  }

  // Notify new head of write queue
  if (!writers_.empty()) {
    writers_.front()->cv.Signal();
  }

  return status;
}